

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O1

int32_t __thiscall icu_63::RBBITableBuilder::getSafeTableSize(RBBITableBuilder *this)

{
  int iVar1;
  int32_t iVar2;
  
  if (this->fSafeTable != (UVector *)0x0) {
    iVar1 = this->fSafeTable->count;
    iVar2 = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
    return (iVar2 * 2 + 8) * iVar1 + 0x10;
  }
  return 0;
}

Assistant:

int32_t  RBBITableBuilder::getSafeTableSize() const {
    int32_t    size = 0;
    int32_t    numRows;
    int32_t    numCols;
    int32_t    rowSize;

    if (fSafeTable == nullptr) {
        return 0;
    }

    size    = offsetof(RBBIStateTable, fTableData);    // The header, with no rows to the table.

    numRows = fSafeTable->size();
    numCols = fRB->fSetBuilder->getNumCharCategories();

    rowSize = offsetof(RBBIStateTableRow, fNextState) + sizeof(uint16_t)*numCols;
    size   += numRows * rowSize;
    return size;
}